

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  int iVar1;
  long lVar2;
  long lVar3;
  pointer __s1;
  ulong uVar4;
  size_t __n;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  sVar8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  lVar2 = *(long *)(this + 0x20);
  iVar1 = *(int *)(this + 0x40);
  lVar3 = *(long *)(this + 0x18);
  __s1 = (key->_M_dataplus)._M_p;
  uVar10 = sVar8 * *(long *)(this + 0x10) >> 0x21 ^ sVar8 * *(long *)(this + 0x10);
  uVar9 = ((uint)uVar10 & 0x1f) >> ((ulong)(byte)this[0x44] & 0x3f);
  uVar4 = *(ulong *)(this + 0x30);
  __n = key->_M_string_length;
  uVar11 = uVar9 + iVar1 * 2;
  uVar9 = iVar1 + uVar9;
  sVar8 = uVar10 >> 5 & uVar4;
  uVar7 = (uint)*(byte *)(lVar2 + sVar8);
  do {
    if ((uVar9 == uVar7) && (puVar5 = *(undefined8 **)(lVar3 + sVar8 * 8), __n == puVar5[1])) {
      if (__n == 0) {
        return sVar8;
      }
      iVar6 = bcmp(__s1,(void *)*puVar5,__n);
      if (iVar6 == 0) {
        return sVar8;
      }
    }
    if ((uVar11 == *(byte *)(lVar2 + 1 + sVar8)) &&
       (puVar5 = *(undefined8 **)(lVar3 + 8 + sVar8 * 8), __n == puVar5[1])) {
      if (__n == 0) {
        return sVar8 + 1;
      }
      iVar6 = bcmp(__s1,(void *)*puVar5,__n);
      if (iVar6 == 0) {
        return sVar8 + 1;
      }
    }
    uVar11 = uVar11 + iVar1 * 2;
    uVar9 = uVar9 + iVar1 * 2;
    uVar7 = (uint)*(byte *)(lVar2 + 2 + sVar8);
    sVar8 = sVar8 + 2;
    if (uVar7 < uVar9) {
      if (uVar4 == 0) {
        sVar8 = 0;
      }
      else {
        sVar8 = lVar2 - lVar3 >> 3;
      }
      return sVar8;
    }
  } while( true );
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }